

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encrypted_client_hello.cc
# Opt level: O1

int SSL_ECH_KEYS_marshal_retry_configs(SSL_ECH_KEYS *keys,uint8_t **out,size_t *out_len)

{
  size_t sVar1;
  unique_ptr<bssl::ECHServerConfig,_bssl::internal::Deleter> *puVar2;
  undefined8 *puVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  ScopedCBB cbb;
  CBB child;
  CBB local_90;
  CBB local_60;
  
  CBB_zero(&local_90);
  iVar4 = CBB_init(&local_90,0x80);
  iVar5 = 0;
  if (iVar4 != 0) {
    iVar4 = CBB_add_u16_length_prefixed(&local_90,&local_60);
    iVar5 = 0;
    if (iVar4 != 0) {
      sVar1 = (keys->configs).size_;
      if (sVar1 != 0) {
        puVar2 = (keys->configs).data_;
        lVar6 = 0;
        do {
          puVar3 = *(undefined8 **)
                    ((long)&(puVar2->_M_t).
                            super___uniq_ptr_impl<bssl::ECHServerConfig,_bssl::internal::Deleter>.
                            _M_t.
                            super__Tuple_impl<0UL,_bssl::ECHServerConfig_*,_bssl::internal::Deleter>
                            .super__Head_base<0UL,_bssl::ECHServerConfig_*,_false>._M_head_impl +
                    lVar6);
          if (*(char *)(puVar3 + 0x17) == '\x01') {
            iVar5 = CBB_add_bytes(&local_60,(uint8_t *)*puVar3,puVar3[1]);
            if (iVar5 == 0) {
              iVar5 = 0;
              goto LAB_00137db1;
            }
          }
          lVar6 = lVar6 + 8;
        } while (sVar1 << 3 != lVar6);
      }
      iVar5 = CBB_finish(&local_90,out,out_len);
    }
  }
LAB_00137db1:
  CBB_cleanup(&local_90);
  return iVar5;
}

Assistant:

int SSL_ECH_KEYS_marshal_retry_configs(const SSL_ECH_KEYS *keys, uint8_t **out,
                                       size_t *out_len) {
  ScopedCBB cbb;
  CBB child;
  if (!CBB_init(cbb.get(), 128) ||
      !CBB_add_u16_length_prefixed(cbb.get(), &child)) {
    return false;
  }
  for (const auto &config : keys->configs) {
    if (config->is_retry_config() &&
        !CBB_add_bytes(&child, config->ech_config().raw.data(),
                       config->ech_config().raw.size())) {
      return false;
    }
  }
  return CBB_finish(cbb.get(), out, out_len);
}